

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::dup2_fds(Container *this)

{
  int iVar1;
  TaskData *pTVar2;
  ContextManager *pCVar3;
  string local_80;
  string local_60;
  string local_30;
  Container *local_10;
  Container *this_local;
  
  local_10 = this;
  pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  if ((pTVar2->stdin_desc).fd != -1) {
    pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    iVar1 = dup2((pTVar2->stdin_desc).fd,0);
    if (iVar1 != 0) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_30,"Cannot dup2 stdin: %m");
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  if ((pTVar2->stdout_desc).fd != -1) {
    pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    iVar1 = dup2((pTVar2->stdout_desc).fd,1);
    if (iVar1 != 1) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_60,"Cannot dup2 stdout: %m");
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  if ((pTVar2->stderr_desc).fd != -1) {
    pTVar2 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    iVar1 = dup2((pTVar2->stderr_desc).fd,2);
    if (iVar1 != 2) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_80,"Cannot dup2 stderr: %m");
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  return;
}

Assistant:

void Container::dup2_fds() {
    if (task_data_->stdin_desc.fd != -1) {
        if (dup2(task_data_->stdin_desc.fd, STDIN_FILENO) != STDIN_FILENO) {
            die(format("Cannot dup2 stdin: %m"));
        }
    }

    if (task_data_->stdout_desc.fd != -1) {
        if (dup2(task_data_->stdout_desc.fd, STDOUT_FILENO) != STDOUT_FILENO) {
            die(format("Cannot dup2 stdout: %m"));
        }
    }

    if (task_data_->stderr_desc.fd != -1) {
        if (dup2(task_data_->stderr_desc.fd, STDERR_FILENO) != STDERR_FILENO) {
            die(format("Cannot dup2 stderr: %m"));
        }
    }
}